

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mine::AddVertexToTripDetonationWire(Mine *this,KUINT16 Index,Vector *Vertex)

{
  pointer ppVar1;
  _Rb_tree_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
  local_28;
  iterator itr;
  Vector *Vertex_local;
  KUINT16 Index_local;
  Mine *this_local;
  
  itr._M_node = (_Base_ptr)Vertex;
  local_28._M_node = (_Base_ptr)getWire(this,Index);
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
           ::operator->(&local_28);
  std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::push_back
            (&ppVar1->second,(value_type *)itr._M_node);
  return;
}

Assistant:

void Mine::AddVertexToTripDetonationWire(KUINT16 Index, const Vector &Vertex) noexcept(false)
{
    map< KUINT16, vector<Vector> >::iterator itr = getWire( Index );
    itr->second.push_back( Vertex );
}